

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_nlist__clear(fct_nlist_t *list,fct_nlist_on_del_t on_del)

{
  size_t local_20;
  size_t itm_i__;
  fct_nlist_on_del_t on_del_local;
  fct_nlist_t *list_local;
  
  if (list == (fct_nlist_t *)0x0) {
    __assert_fail("list != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x2dd
                  ,"void fct_nlist__clear(fct_nlist_t *, fct_nlist_on_del_t)");
  }
  if (on_del != (fct_nlist_on_del_t)0x0) {
    for (local_20 = 0; local_20 != list->used_itm_num; local_20 = local_20 + 1) {
      (*on_del)(list->itm_list[local_20]);
    }
  }
  list->used_itm_num = 0;
  return;
}

Assistant:

static void
fct_nlist__clear(fct_nlist_t *list, fct_nlist_on_del_t on_del)
{
    size_t itm_i__ =0;
    FCT_ASSERT( list != NULL );
    if ( on_del != NULL )
    {
        for ( itm_i__=0; itm_i__ != list->used_itm_num; ++itm_i__ )
        {
            on_del(list->itm_list[itm_i__]);
        }
    }
    list->used_itm_num =0;
}